

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix-test.cc
# Opt level: O3

void __thiscall
SuffixTest_MutIntSuffix_Test::~SuffixTest_MutIntSuffix_Test(SuffixTest_MutIntSuffix_Test *this)

{
  (this->super_SuffixTest).super_Test._vptr_Test = (_func_int **)&PTR__SuffixTest_00172bb0;
  mp::BasicSuffixSet<std::allocator<char>_>::~BasicSuffixSet(&(this->super_SuffixTest).suffixes_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F(SuffixTest, MutIntSuffix) {
  mp::MutIntSuffix s;
  EXPECT_TRUE(s == 0);
  s = suffixes_.Add<int>("test", 11, 222);
  EXPECT_STREQ("test", s.name());
  EXPECT_EQ(11, s.kind());
  EXPECT_EQ(222, s.num_values());
  EXPECT_TRUE(IsInt<mp::IntSuffix::Type>::VALUE);
  MutSuffix csuf = s;
  csuf = s;
}